

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86SAL(uchar *stream,x86Reg reg)

{
  bool bVar1;
  
  bVar1 = 8 < (int)reg;
  if (bVar1) {
    *stream = 8 < (int)reg | 0x40;
  }
  stream[bVar1] = 0xd3;
  stream[(ulong)bVar1 + 1] = regCode[reg] | 0xe0;
  return bVar1 + 2;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}